

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAParameters.cpp
# Opt level: O0

ByteString * __thiscall RSAParameters::serialise(RSAParameters *this)

{
  ByteString *in_RDI;
  ByteString len;
  ByteString *in_stack_ffffffffffffff70;
  ByteString *in_stack_ffffffffffffff78;
  ByteString *in_stack_ffffffffffffff80;
  ByteString *in_stack_ffffffffffffff98;
  
  ByteString::ByteString(in_stack_ffffffffffffff80,(unsigned_long)in_stack_ffffffffffffff78);
  ByteString::serialise(in_stack_ffffffffffffff98);
  ByteString::serialise(in_stack_ffffffffffffff98);
  operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ByteString::~ByteString((ByteString *)0x15050b);
  ByteString::~ByteString((ByteString *)0x150515);
  ByteString::~ByteString((ByteString *)0x150522);
  return in_RDI;
}

Assistant:

ByteString RSAParameters::serialise() const
{
	ByteString len(bitLen);

	return e.serialise() + len.serialise();
}